

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::assign<unit_test>
          (url_dispatcher *this,string *regex,member_type member,unit_test *object)

{
  member_type in_R8;
  member_type *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (member_type *)0x0;
  uStack_50 = 0;
  local_58 = (member_type *)operator_new(0x18);
  *local_58 = member;
  local_58[1] = (member_type)object;
  local_58[2] = in_R8;
  pcStack_40 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<unit_test>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<unit_test>_>::
             _M_manager;
  cppcms::url_dispatcher::assign(this,regex,&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(),C *object)
		{
			assign(regex,binder0<C>(member,object));
		}